

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O0

int Abc_NodeEvalMvCost(int nVars,Vec_Int_t *vSop0,Vec_Int_t *vSop1)

{
  int iVar1;
  int *pVarValues_00;
  char *pMvSop_00;
  int local_34;
  int RetValue;
  int i;
  int *pVarValues;
  char *pMvSop;
  Vec_Int_t *vSop1_local;
  Vec_Int_t *vSop0_local;
  int nVars_local;
  
  pVarValues_00 = (int *)malloc((long)(nVars + 1) << 2);
  for (local_34 = 0; local_34 <= nVars; local_34 = local_34 + 1) {
    pVarValues_00[local_34] = 2;
  }
  pMvSop_00 = Abc_NodeConvertSopToMvSop(nVars,vSop0,vSop1);
  iVar1 = Abc_NodeEvalMvCostInternal(nVars,pVarValues_00,pMvSop_00);
  if (pVarValues_00 != (int *)0x0) {
    free(pVarValues_00);
  }
  if (pMvSop_00 != (char *)0x0) {
    free(pMvSop_00);
  }
  return iVar1;
}

Assistant:

int Abc_NodeEvalMvCost( int nVars, Vec_Int_t * vSop0, Vec_Int_t * vSop1 ) 
{
    char * pMvSop;
    int * pVarValues;
    int i, RetValue;
    // collect the input and output values (currently, they are binary)
    pVarValues = ABC_ALLOC( int, nVars + 1 );
    for ( i = 0; i <= nVars; i++ )
        pVarValues[i] = 2;
    // prepare MV-SOP for evaluation
    pMvSop = Abc_NodeConvertSopToMvSop( nVars, vSop0, vSop1 );
    // have a look at the MV-SOP:
//    printf( "%s\n", pMvSop );
    // get the result of internal cost evaluation
    RetValue = Abc_NodeEvalMvCostInternal( nVars, pVarValues, pMvSop );
    // cleanup
    ABC_FREE( pVarValues );
    ABC_FREE( pMvSop );
    return RetValue;
}